

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lejp.c
# Opt level: O0

char cb(lejp_ctx *ctx,char reason)

{
  int iVar1;
  char *pcVar2;
  char *str;
  int local_440;
  int local_43c;
  int n_1;
  int n;
  char *end;
  char *p;
  char buf [1024];
  char reason_local;
  lejp_ctx *ctx_local;
  
  pcVar2 = buf + 0x3f8;
  end = (char *)&p;
  for (local_43c = 0; local_43c < (int)(uint)ctx->sp; local_43c = local_43c + 1) {
    *end = ' ';
    end = end + 1;
  }
  *end = '\0';
  if ((reason & 0x40U) == 0) {
    if (reason == '\x03') {
      _lws_log(4,"%sParsing Completed (LEJPCB_COMPLETE)\n",&p);
    }
    else if (reason == '\x05') {
      _lws_log(4,"%spath: \'%s\' (LEJPCB_PAIR_NAME)\n",&p,ctx->path);
    }
    _lws_log(4,"%s%s: path %s match %d statckp %d\r\n",&p,reason_names[(int)reason & 0x3f],ctx->path
             ,(ulong)ctx->path_match,(uint)ctx->pst[ctx->pst_sp].ppos);
  }
  else {
    iVar1 = lws_snprintf(end,(long)end - (long)pcVar2,"   value \'%s\' ",ctx->buf);
    str = end + iVar1;
    if (ctx->ipos != '\0') {
      iVar1 = lws_snprintf(str,(long)str - (long)pcVar2,"(array indexes: ");
      end = str + iVar1;
      for (local_440 = 0; local_440 < (int)(uint)ctx->ipos; local_440 = local_440 + 1) {
        iVar1 = lws_snprintf(end,(long)end - (long)pcVar2,"%d ",(ulong)ctx->i[local_440]);
        end = end + iVar1;
      }
      lws_snprintf(end,(long)end - (long)pcVar2,") ");
    }
    _lws_log(4,"%s (%s)\r\n",&p,reason_names[(int)reason & 0x3f]);
  }
  return '\0';
}

Assistant:

static signed char
cb(struct lejp_ctx *ctx, char reason)
{
	char buf[1024], *p = buf, *end = &buf[sizeof(buf)];
	int n;

	for (n = 0; n < ctx->sp; n++)
		*p++ = ' ';
	*p = '\0';

	if (reason & LEJP_FLAG_CB_IS_VALUE) {
		p += lws_snprintf(p, p - end, "   value '%s' ", ctx->buf);
		if (ctx->ipos) {
			int n;

			p += lws_snprintf(p, p - end, "(array indexes: ");
			for (n = 0; n < ctx->ipos; n++)
				p += lws_snprintf(p, p - end, "%d ", ctx->i[n]);
			p += lws_snprintf(p, p - end, ") ");
		}
		lwsl_notice("%s (%s)\r\n", buf,
		       reason_names[(unsigned int)
			(reason) & (LEJP_FLAG_CB_IS_VALUE - 1)]);

		(void)reason_names; /* NO_LOGS... */
		return 0;
	}

	switch (reason) {
	case LEJPCB_COMPLETE:
		lwsl_notice("%sParsing Completed (LEJPCB_COMPLETE)\n", buf);
		break;
	case LEJPCB_PAIR_NAME:
		lwsl_notice("%spath: '%s' (LEJPCB_PAIR_NAME)\n", buf, ctx->path);
		break;
	}

	lwsl_notice("%s%s: path %s match %d statckp %d\r\n", buf, reason_names[(unsigned int)
		(reason) & (LEJP_FLAG_CB_IS_VALUE - 1)], ctx->path,
		ctx->path_match, ctx->pst[ctx->pst_sp].ppos);

	return 0;
}